

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

void alsa_destroy(cubeb_conflict1 *ctx)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  if (ctx == (cubeb_conflict1 *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x3ac,"void alsa_destroy(cubeb *)");
  }
  __mutex = &ctx->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  ctx->shutdown = 1;
  write(ctx->control_fd_write,"x",1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  iVar1 = pthread_join(ctx->thread,(void **)0x0);
  if (iVar1 == 0) {
    close(ctx->control_fd_read);
    close(ctx->control_fd_write);
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    free(ctx->fds);
    if (ctx->local_config != (snd_config_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
      (*cubeb_snd_config_delete)(ctx->local_config);
      pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
    }
    if (ctx->libasound != (void *)0x0) {
      dlclose();
    }
    free(ctx);
    return;
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                ,0x3b4,"void alsa_destroy(cubeb *)");
}

Assistant:

static void
alsa_destroy(cubeb * ctx)
{
  int r;

  assert(ctx);

  pthread_mutex_lock(&ctx->mutex);
  ctx->shutdown = 1;
  poll_wake(ctx);
  pthread_mutex_unlock(&ctx->mutex);

  r = pthread_join(ctx->thread, NULL);
  assert(r == 0);

  close(ctx->control_fd_read);
  close(ctx->control_fd_write);
  pthread_mutex_destroy(&ctx->mutex);
  free(ctx->fds);

  if (ctx->local_config) {
    pthread_mutex_lock(&cubeb_alsa_mutex);
    WRAP(snd_config_delete)(ctx->local_config);
    pthread_mutex_unlock(&cubeb_alsa_mutex);
  }

  if (ctx->libasound) {
    dlclose(ctx->libasound);
  }

  free(ctx);
}